

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

bool __thiscall
glcts::TextureCubeMapArraySamplingTest::verifyResult
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          resolutionDefinition *resolution,samplingFunction sampling_function,uchar *data)

{
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *p_Var1;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *p_Var2;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *p_Var3;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLint_ptr *p_Var4;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *p_Var5;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *p_Var6;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *p_Var7;
  bool bVar8;
  code *this_00;
  componentProvider local_48;
  
  local_48.getDepthComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)0x0;
  local_48.getStencilComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)0x0;
  local_48.getColorUintComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLuint_ptr *)0x0;
  local_48.getColorIntComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLint_ptr *)0x0;
  local_48.getColorFloatComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLfloat_ptr *)0x0;
  local_48.getColorUByteComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)0x0;
  local_48.getCompressedComponents = (_func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *)0x0;
  if (sampling_function - TextureLod < 2) {
    this_00 = getExpectedStencilComponentsForTextureLod;
    p_Var1 = getExpectedColorFloatComponentsForTextureLod;
    p_Var2 = getExpectedColorIntComponentsForTextureLod<unsigned_char>;
    p_Var3 = getExpectedColorIntComponentsForTextureLod<unsigned_int>;
    p_Var4 = getExpectedColorIntComponentsForTextureLod<int>;
    p_Var5 = getExpectedDepthComponentsForTextureLod;
    p_Var6 = this_00;
    p_Var7 = getExpectedCompressedComponentsForTextureLod;
  }
  else {
    this_00 = getExpectedStencilComponentsForTexture;
    p_Var1 = getExpectedColorFloatComponentsForTexture;
    p_Var2 = getExpectedColorIntComponentsForTexture<unsigned_char>;
    p_Var3 = getExpectedColorIntComponentsForTexture<unsigned_int>;
    p_Var4 = getExpectedColorIntComponentsForTexture<int>;
    p_Var5 = getExpectedDepthComponentsForTexture;
    p_Var6 = this_00;
    p_Var7 = getExpectedCompressedComponentsForTexture;
    if ((sampling_function != Texture) && (sampling_function != TextureGather)) {
      p_Var1 = local_48.getColorFloatComponents;
      p_Var2 = local_48.getColorUByteComponents;
      p_Var3 = local_48.getColorUintComponents;
      p_Var4 = local_48.getColorIntComponents;
      p_Var5 = local_48.getDepthComponents;
      p_Var6 = local_48.getStencilComponents;
      p_Var7 = local_48.getCompressedComponents;
    }
  }
  local_48.getCompressedComponents = p_Var7;
  local_48.getStencilComponents = p_Var6;
  local_48.getDepthComponents = p_Var5;
  local_48.getColorIntComponents = p_Var4;
  local_48.getColorUintComponents = p_Var3;
  local_48.getColorUByteComponents = p_Var2;
  local_48.getColorFloatComponents = p_Var1;
  bVar8 = verifyResultHelper((TextureCubeMapArraySamplingTest *)this_00,format,resolution,&local_48,
                             data);
  return bVar8;
}

Assistant:

bool TextureCubeMapArraySamplingTest::verifyResult(const formatDefinition&	 format,
												   const resolutionDefinition& resolution,
												   const samplingFunction sampling_function, unsigned char* data)
{
	componentProvider component_provider = { NULL, NULL, NULL, NULL, NULL, NULL, NULL };

	switch (sampling_function)
	{
	case Texture:
	case TextureGather:
		component_provider.getColorFloatComponents = getExpectedColorFloatComponentsForTexture;
		component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTexture<glw::GLubyte>;
		component_provider.getColorUintComponents  = getExpectedColorIntComponentsForTexture<glw::GLuint>;
		component_provider.getColorIntComponents   = getExpectedColorIntComponentsForTexture<glw::GLint>;
		component_provider.getDepthComponents	  = getExpectedDepthComponentsForTexture;
		component_provider.getStencilComponents	= getExpectedStencilComponentsForTexture;
		component_provider.getCompressedComponents = getExpectedCompressedComponentsForTexture;
		break;
	case TextureLod:
	case TextureGrad:
		component_provider.getColorFloatComponents = getExpectedColorFloatComponentsForTextureLod;
		component_provider.getColorUByteComponents = getExpectedColorIntComponentsForTextureLod<glw::GLubyte>;
		component_provider.getColorUintComponents  = getExpectedColorIntComponentsForTextureLod<glw::GLuint>;
		component_provider.getColorIntComponents   = getExpectedColorIntComponentsForTextureLod<glw::GLint>;
		component_provider.getDepthComponents	  = getExpectedDepthComponentsForTextureLod;
		component_provider.getStencilComponents	= getExpectedStencilComponentsForTextureLod;
		component_provider.getCompressedComponents = getExpectedCompressedComponentsForTextureLod;
		break;
	}

	return verifyResultHelper(format, resolution, component_provider, data);
}